

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

void __thiscall ztimer::TimerManager::Turn(TimerManager *this,uint pos)

{
  int *piVar1;
  _Hash_node_value<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false> *__k;
  int iVar2;
  mapped_type *pmVar3;
  long lVar4;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false> __it;
  Timer *local_80;
  undefined8 local_78;
  Timer *timer;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_68;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  __it._M_cur = (__node_type *)
                (this->timeWheel).
                super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[pos]._M_h._M_before_begin._M_nxt;
  local_68 = &(this->timerMap)._M_h;
LAB_0012c3cf:
  do {
    while( true ) {
      if (__it._M_cur == (__node_type *)0x0) {
        return;
      }
      piVar1 = (int *)((long)&((__it._M_cur)->
                              super__Hash_node_value<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>
                              ._M_storage._M_storage + 0x10);
      iVar2 = *piVar1;
      *piVar1 = *piVar1 + -1;
      if (iVar2 == 0) break;
LAB_0012c451:
      __it._M_cur = (__node_type *)((__it._M_cur)->super__Hash_node_base)._M_nxt;
    }
    __k = &(__it._M_cur)->
           super__Hash_node_value<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
    ;
    timer = *(Timer **)
             &((__it._M_cur)->
              super__Hash_node_value<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
              ).
              super__Hash_node_value_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>
              ._M_storage._M_storage;
    iVar2 = *(int *)((long)&((__it._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>
                            ._M_storage._M_storage + 8);
    if (iVar2 != 0) {
      if (iVar2 == 2) {
        pmVar3 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->AbsTimerMap,(key_type *)__k);
        lVar4 = std::chrono::_V2::system_clock::now();
        if ((pmVar3->__d).__r <= lVar4) {
          local_80 = (Timer *)0x11;
          local_78 = 0;
          std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>
                    ((launch)local_60,(type *)0x1,&local_80);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(local_68,__k);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_erase(&(this->AbsTimerMap)._M_h,__k);
          goto LAB_0012c4e0;
        }
      }
      else {
        if (iVar2 != 1) goto LAB_0012c3cf;
        local_80 = (Timer *)0x11;
        local_78 = 0;
        std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>((launch)local_40,(type *)0x1,&local_80)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      }
      *(undefined4 *)
       ((long)&((__it._M_cur)->
               super__Hash_node_value<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
               ).
               super__Hash_node_value_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>
               ._M_storage._M_storage + 0x10) =
           *(undefined4 *)
            ((long)&((__it._M_cur)->
                    super__Hash_node_value<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_false>
                    ).
                    super__Hash_node_value_base<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>
                    ._M_storage._M_storage + 0xc);
      goto LAB_0012c451;
    }
    local_80 = (Timer *)0x11;
    local_78 = 0;
    std::async<void(ztimer::Timer::*)(),ztimer::Timer*&>((launch)local_50,(type *)0x1,&local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(local_68,__k);
LAB_0012c4e0:
    __it._M_cur = (__node_type *)
                  std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::erase(&(this->timeWheel).
                           super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[pos]._M_h,__it._M_cur);
  } while( true );
}

Assistant:

void TimerManager::Turn(unsigned int pos)
    {
        for (auto iter = timeWheel[pos].begin(); iter != timeWheel[pos].end();) {
            if (iter->second[2]-- == 0) {
                Timer* timer = reinterpret_cast<Timer*>(iter->first);
                switch (static_cast<Mode>(iter->second[0])) {
                    case REL_LOOP: {
                        std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                        iter->second[2] = iter->second[1];
                        iter++;
                    } break;
                    case REL_ONCE: {
                        std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                        // 移除一次性相对定时器
                        timerMap.erase(iter->first);
                        iter = timeWheel[pos].erase(iter);
                    } break;
                    case ABS_ONCE: {
                        if (AbsTimerMap[iter->first] <= Now()) {
                            std::async(std::launch::async, &Timer::TimeOut, timer);  // 异步执行超时函数
                            // 移除绝对定时器
                            timerMap.erase(iter->first);
                            AbsTimerMap.erase(iter->first);
                            iter = timeWheel[pos].erase(iter);
                        }
                        else {
                            iter->second[2] = iter->second[1];
                            iter++;
                        }
                    }
                    default: break;
                }
            }
            else {
                iter++;
            }
        }
    }